

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<lest::approx_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<lest::approx_const&> *this,double *rhs)

{
  lest *this_00;
  bool bVar1;
  double *in_R8;
  allocator<char> local_69;
  string local_68;
  approx local_48;
  
  bVar1 = lest::operator!=(*(approx **)this,*rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"!=",&local_69);
  to_string<lest::approx,double>(&local_68,this_00,&local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }